

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

ImGuiTabBar * __thiscall ImPool<ImGuiTabBar>::Add(ImPool<ImGuiTabBar> *this)

{
  int iVar1;
  ImGuiTabBar *__src;
  int iVar2;
  ImGuiTabBar *__dest;
  int iVar3;
  int iVar4;
  
  iVar1 = this->FreeIdx;
  iVar2 = (this->Data).Size;
  if (iVar1 == iVar2) {
    iVar3 = iVar1 + 1;
    iVar4 = (this->Data).Capacity;
    iVar2 = iVar3;
    if (iVar4 <= iVar1) {
      if (iVar4 == 0) {
        iVar4 = 8;
      }
      else {
        iVar4 = iVar4 / 2 + iVar4;
      }
      if (iVar4 <= iVar3) {
        iVar4 = iVar3;
      }
      __dest = (ImGuiTabBar *)ImGui::MemAlloc((long)iVar4 << 7);
      __src = (this->Data).Data;
      if (__src != (ImGuiTabBar *)0x0) {
        memcpy(__dest,__src,(long)(this->Data).Size << 7);
        ImGui::MemFree((this->Data).Data);
      }
      (this->Data).Data = __dest;
      (this->Data).Capacity = iVar4;
      iVar2 = this->FreeIdx + 1;
    }
    (this->Data).Size = iVar3;
  }
  else {
    if (iVar2 <= iVar1) goto LAB_0018a323;
    iVar2 = (this->Data).Data[iVar1].Tabs.Size;
  }
  this->FreeIdx = iVar2;
  ImGuiTabBar::ImGuiTabBar((this->Data).Data + iVar1);
  if (iVar1 < (this->Data).Size) {
    return (this->Data).Data + iVar1;
  }
LAB_0018a323:
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.h"
                ,0x4d8,"T &ImVector<ImGuiTabBar>::operator[](int) [T = ImGuiTabBar]");
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Data.Size) { Data.resize(Data.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Data[idx]; } IM_PLACEMENT_NEW(&Data[idx]) T(); return &Data[idx]; }